

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall
optimization::graph_color::Graph_Color::optimize_func
          (Graph_Color *this,string *funcId,MirFunction *func)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  element_type *peVar4;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *pmVar5;
  ostream *poVar6;
  __shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var7;
  __shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Base_ptr p_Var9;
  __shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Rb_tree_node_base *p_Var11;
  Graph_Color *pGVar12;
  size_type sVar13;
  element_type *peVar14;
  _Self __tmp;
  Tag *tag;
  MirFunction *tag_00;
  char *pcVar15;
  Function *pFVar16;
  __hashtable *__h;
  allocator<char> local_36a;
  allocator<char> local_369;
  Graph_Color *local_368;
  undefined **local_360;
  undefined8 local_358;
  undefined1 local_350;
  VarId var;
  allocator<char> local_331;
  string local_330;
  undefined1 local_310 [32];
  mapped_type conflict_map;
  Tag local_2e0;
  undefined1 local_2b0 [16];
  undefined4 local_2a0;
  shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
  map;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  cross_blk_vars;
  undefined1 local_208 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  undefined1 local_1e8 [16];
  Livevar_Analyse lva;
  
  if (((func->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      is_extern == false) {
    local_330._M_dataplus._M_p._0_1_ = 0;
    tag = (Tag *)funcId;
    local_368 = this;
    AixLog::operator<<((ostream *)&local_330,(Severity *)funcId);
    AixLog::Tag::Tag((Tag *)local_2b0);
    AixLog::operator<<((ostream *)local_2b0,tag);
    local_310._8_8_ = std::chrono::_V2::system_clock::now();
    local_310._0_8_ = &PTR__Timestamp_001d8f28;
    local_310[0x10] = 0;
    AixLog::operator<<((ostream *)local_310,(Timestamp *)tag);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cross_blk_vars,"optimize_func",(allocator<char> *)&local_360);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,(allocator<char> *)&map);
    pFVar16 = (Function *)&cross_blk_vars;
    AixLog::Function::Function((Function *)&lva,(string *)pFVar16,(string *)&local_2e0,0x181);
    AixLog::operator<<((ostream *)&lva,pFVar16);
    poVar6 = std::operator<<((ostream *)&std::clog,"Running graph coloring for");
    poVar6 = std::operator<<(poVar6,(string *)&func->name);
    std::endl<char,std::char_traits<char>>(poVar6);
    AixLog::Function::~Function((Function *)&lva);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&cross_blk_vars);
    AixLog::Tag::~Tag((Tag *)local_2b0);
    cross_blk_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cross_blk_vars._M_t._M_impl.super__Rb_tree_header._M_header;
    cross_blk_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    cross_blk_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    cross_blk_vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var2 = &lva.livevars._M_t._M_impl.super__Rb_tree_header;
    lva.livevars._M_t._M_impl._0_8_ = 0;
    lva.livevars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lva.livevars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    lva.livevars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lva.livevars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cross_blk_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         cross_blk_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lva.livevars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    lva.livevars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    std::
    make_shared<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>,std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>
              ((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                *)&map);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                 *)&lva);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
                *)&lva,funcId,&map);
    this_00 = &local_368->func_color_map;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,&lva);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
             *)&lva);
    p_Var7 = &std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,funcId)->
              super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::
    __shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_208 + 0x10),p_Var7);
    Conflict_Map::Conflict_Map
              ((Conflict_Map *)&lva,
               (shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                *)(local_208 + 0x10),func,local_368->color_num);
    std::
    make_shared<optimization::graph_color::Conflict_Map,optimization::graph_color::Conflict_Map>
              ((Conflict_Map *)local_2b0);
    this_01 = &local_368->func_conflict_map;
    p_Var8 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
              ::operator[](this_01,funcId)->
              super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::__shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>::
    operator=(p_Var8,(__shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                      *)local_2b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b0 + 8));
    Conflict_Map::~Conflict_Map((Conflict_Map *)&lva);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0);
    p_Var8 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
              ::operator[](this_01,funcId)->
              super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::__shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&conflict_map.
                  super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                 ,p_Var8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)&lva,funcId,
               &(conflict_map.
                 super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->unused_colors);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::set<int,std::less<int>,std::allocator<int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_368->func_unused_colors,&lva);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             *)&lva);
    tag_00 = func;
    livevar_analyse::Livevar_Analyse::Livevar_Analyse(&lva,func,true);
    livevar_analyse::Livevar_Analyse::build(&lva);
    for (p_Var9 = lva.livevars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != p_Var2; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      std::__shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                    *)local_1e8,
                   (__shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                    *)&p_Var9[1]._M_parent);
      tag_00 = (MirFunction *)local_1e8;
      init_cross_blk_vars(local_368,(sharedPtrBlkLivevar *)local_1e8,&cross_blk_vars);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
    }
    var.super_Displayable._vptr_Displayable =
         var.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
    AixLog::operator<<((ostream *)&var,(Severity *)tag_00);
    AixLog::Tag::Tag(&local_2e0);
    AixLog::operator<<((ostream *)&local_2e0,(Tag *)tag_00);
    local_358 = std::chrono::_V2::system_clock::now();
    local_360 = &PTR__Timestamp_001d8f28;
    local_350 = 0;
    AixLog::operator<<((ostream *)&local_360,(Timestamp *)tag_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_310,"optimize_func",&local_36a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,&local_369);
    pFVar16 = (Function *)local_310;
    AixLog::Function::Function((Function *)local_2b0,(string *)pFVar16,&local_330,0x18e);
    AixLog::operator<<((ostream *)local_2b0,pFVar16);
    pcVar15 = " Conflict map :";
    poVar6 = std::operator<<((ostream *)&std::clog," Conflict map :");
    std::endl<char,std::char_traits<char>>(poVar6);
    AixLog::Function::~Function((Function *)local_2b0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)local_310);
    AixLog::Tag::~Tag(&local_2e0);
    if (local_368->enable == true) {
      for (p_Var9 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        p_Var10 = &std::
                   map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                   ::operator[](&lva.livevars,(key_type *)(p_Var9 + 1))->
                   super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
        ;
        std::__shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr((__shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                        *)local_208,p_Var10);
        pcVar15 = (char *)local_208;
        init_conflict_map(local_368,
                          (shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)local_208,
                          &conflict_map,&cross_blk_vars);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
      }
      Conflict_Map::init_edge_vars
                (conflict_map.
                 super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      pmVar5 = &(conflict_map.
                 super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->dynamic_Map;
      for (pGVar12 = (Graph_Color *)
                     ((conflict_map.
                       super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pGVar12 != (Graph_Color *)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
          pGVar12 = (Graph_Color *)std::_Rb_tree_increment((_Rb_tree_node_base *)pGVar12)) {
        var.super_Displayable._vptr_Displayable =
             var.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
        AixLog::operator<<((ostream *)&var,(Severity *)pcVar15);
        AixLog::Tag::Tag(&local_2e0);
        AixLog::operator<<((ostream *)&local_2e0,(Tag *)pcVar15);
        local_358 = std::chrono::_V2::system_clock::now();
        local_360 = &PTR__Timestamp_001d8f28;
        local_350 = 0;
        AixLog::operator<<((ostream *)&local_360,(Timestamp *)pcVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_310,"optimize_func",&local_36a);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                   ,&local_369);
        pFVar16 = (Function *)local_310;
        AixLog::Function::Function((Function *)local_2b0,(string *)local_310,&local_330,0x198);
        AixLog::operator<<((ostream *)local_2b0,pFVar16);
        paVar1 = &(pGVar12->name).field_2;
        (*(code *)**(undefined8 **)paVar1)(paVar1,&std::clog);
        pcVar15 = " conflicts with : ";
        std::operator<<((ostream *)&std::clog," conflicts with : ");
        AixLog::Function::~Function((Function *)local_2b0);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_310);
        AixLog::Tag::~Tag(&local_2e0);
        local_368 = pGVar12;
        for (p_Var11 = (pGVar12->blk_livevar_analyse)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent; p_Var11 != (_Rb_tree_node_base *)&pGVar12->blk_livevar_analyse;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          var.id = *(uint32_t *)&p_Var11[1]._M_parent;
          local_36a = (allocator<char>)0x0;
          AixLog::operator<<((ostream *)&local_36a,(Severity *)pcVar15);
          AixLog::Tag::Tag(&local_2e0);
          AixLog::operator<<((ostream *)&local_2e0,(Tag *)pcVar15);
          local_358 = std::chrono::_V2::system_clock::now();
          local_360 = &PTR__Timestamp_001d8f28;
          local_350 = 0;
          AixLog::operator<<((ostream *)&local_360,(Timestamp *)pcVar15);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_310,"optimize_func",&local_369);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330,
                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                     ,&local_331);
          pFVar16 = (Function *)local_310;
          AixLog::Function::Function((Function *)local_2b0,(string *)local_310,&local_330,0x19a);
          AixLog::operator<<((ostream *)local_2b0,pFVar16);
          (**var.super_Displayable._vptr_Displayable)(&var,&std::clog);
          pcVar15 = ", ";
          std::operator<<((ostream *)&std::clog,", ");
          AixLog::Function::~Function((Function *)local_2b0);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)local_310);
          AixLog::Tag::~Tag(&local_2e0);
        }
        var.super_Displayable._vptr_Displayable =
             var.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
        AixLog::operator<<((ostream *)&var,(Severity *)pcVar15);
        AixLog::Tag::Tag(&local_2e0);
        pGVar12 = local_368;
        AixLog::operator<<((ostream *)&local_2e0,(Tag *)pcVar15);
        local_358 = std::chrono::_V2::system_clock::now();
        local_360 = &PTR__Timestamp_001d8f28;
        local_350 = 0;
        AixLog::operator<<((ostream *)&local_360,(Timestamp *)pcVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_310,"optimize_func",&local_36a);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                   ,&local_369);
        pcVar15 = (char *)local_310;
        AixLog::Function::Function((Function *)local_2b0,(string *)local_310,&local_330,0x19c);
        AixLog::operator<<((ostream *)local_2b0,(Function *)pcVar15);
        std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
        AixLog::Function::~Function((Function *)local_2b0);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_310);
        AixLog::Tag::~Tag(&local_2e0);
      }
      while (((conflict_map.
               super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        Conflict_Map::remove_edge_less_colors
                  (conflict_map.
                   super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        Conflict_Map::remove_edge_larger_colors
                  (conflict_map.
                   super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      Conflict_Map::rebuild
                (conflict_map.
                 super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    for (p_Var9 = cross_blk_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &cross_blk_vars._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      pcVar15 = (char *)(p_Var9 + 1);
      sVar13 = std::
               map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
               ::count(((conflict_map.
                         super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->color_map).
                       super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(key_type *)pcVar15);
      if (sVar13 == 0) {
        local_2b0._0_8_ = &PTR_display_001d90d0;
        local_2b0._8_4_ = *(undefined4 *)&p_Var9[1]._M_parent;
        local_2a0 = 0xffffffff;
        pcVar15 = (char *)local_2b0;
        std::
        _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
        ::_M_emplace_unique<std::pair<mir::inst::VarId,int>>
                  ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
                    *)((conflict_map.
                        super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->color_map).
                      super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(pair<mir::inst::VarId,_int> *)local_2b0);
      }
    }
    var.super_Displayable._vptr_Displayable =
         var.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
    AixLog::operator<<((ostream *)&var,(Severity *)pcVar15);
    AixLog::Tag::Tag(&local_2e0);
    AixLog::operator<<((ostream *)&local_2e0,(Tag *)pcVar15);
    local_358 = std::chrono::_V2::system_clock::now();
    local_360 = &PTR__Timestamp_001d8f28;
    local_350 = 0;
    AixLog::operator<<((ostream *)&local_360,(Timestamp *)pcVar15);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_310,"optimize_func",&local_36a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,&local_369);
    pFVar16 = (Function *)local_310;
    AixLog::Function::Function((Function *)local_2b0,(string *)pFVar16,&local_330,0x1aa);
    AixLog::operator<<((ostream *)local_2b0,pFVar16);
    poVar6 = std::operator<<((ostream *)&std::clog,(string *)&func->name);
    pcVar15 = " coloring result : ";
    poVar6 = std::operator<<(poVar6," coloring result : ");
    std::endl<char,std::char_traits<char>>(poVar6);
    AixLog::Function::~Function((Function *)local_2b0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)local_310);
    AixLog::Tag::~Tag(&local_2e0);
    var.super_Displayable._vptr_Displayable =
         var.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
    AixLog::operator<<((ostream *)&var,(Severity *)pcVar15);
    AixLog::Tag::Tag(&local_2e0);
    AixLog::operator<<((ostream *)&local_2e0,(Tag *)pcVar15);
    local_358 = std::chrono::_V2::system_clock::now();
    local_360 = &PTR__Timestamp_001d8f28;
    local_350 = 0;
    AixLog::operator<<((ostream *)&local_360,(Timestamp *)pcVar15);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_310,"optimize_func",&local_36a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,&local_369);
    pFVar16 = (Function *)local_310;
    AixLog::Function::Function((Function *)local_2b0,(string *)pFVar16,&local_330,0x1ab);
    AixLog::operator<<((ostream *)local_2b0,pFVar16);
    pcVar15 = "unused colors : ";
    std::operator<<((ostream *)&std::clog,"unused colors : ");
    AixLog::Function::~Function((Function *)local_2b0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)local_310);
    AixLog::Tag::~Tag(&local_2e0);
    peVar4 = ((conflict_map.
               super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->unused_colors).
             super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_368 = (Graph_Color *)&(peVar4->_M_t)._M_impl.super__Rb_tree_header;
    for (p_Var11 = (peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (Graph_Color *)p_Var11 != local_368;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      _Var3 = p_Var11[1]._M_color;
      var.super_Displayable._vptr_Displayable =
           (_func_int **)((ulong)var.super_Displayable._vptr_Displayable._1_7_ << 8);
      AixLog::operator<<((ostream *)&var,(Severity *)pcVar15);
      AixLog::Tag::Tag(&local_2e0);
      AixLog::operator<<((ostream *)&local_2e0,(Tag *)pcVar15);
      local_358 = std::chrono::_V2::system_clock::now();
      local_360 = &PTR__Timestamp_001d8f28;
      local_350 = 0;
      AixLog::operator<<((ostream *)&local_360,(Timestamp *)pcVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_310,"optimize_func",&local_36a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                 ,&local_369);
      pFVar16 = (Function *)local_310;
      AixLog::Function::Function((Function *)local_2b0,(string *)local_310,&local_330,0x1ad);
      AixLog::operator<<((ostream *)local_2b0,pFVar16);
      poVar6 = (ostream *)std::ostream::operator<<(&std::clog,_Var3);
      pcVar15 = " ";
      std::operator<<(poVar6," ");
      AixLog::Function::~Function((Function *)local_2b0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)local_310);
      AixLog::Tag::~Tag(&local_2e0);
    }
    var.super_Displayable._vptr_Displayable =
         (_func_int **)((ulong)var.super_Displayable._vptr_Displayable._1_7_ << 8);
    AixLog::operator<<((ostream *)&var,(Severity *)pcVar15);
    AixLog::Tag::Tag(&local_2e0);
    AixLog::operator<<((ostream *)&local_2e0,(Tag *)pcVar15);
    local_358 = std::chrono::_V2::system_clock::now();
    local_360 = &PTR__Timestamp_001d8f28;
    local_350 = 0;
    AixLog::operator<<((ostream *)&local_360,(Timestamp *)pcVar15);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_310,"optimize_func",&local_36a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,&local_369);
    pFVar16 = (Function *)local_310;
    AixLog::Function::Function((Function *)local_2b0,(string *)pFVar16,&local_330,0x1af);
    AixLog::operator<<((ostream *)local_2b0,pFVar16);
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
    AixLog::Function::~Function((Function *)local_2b0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)local_310);
    AixLog::Tag::~Tag(&local_2e0);
    peVar14 = ((conflict_map.
                super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->color_map).
              super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    p_Var11 = (peVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var11 != &(peVar14->_M_t)._M_impl.super__Rb_tree_header) {
      var.super_Displayable._vptr_Displayable =
           (_func_int **)((ulong)var.super_Displayable._vptr_Displayable._1_7_ << 8);
      AixLog::operator<<((ostream *)&var,(Severity *)pFVar16);
      AixLog::Tag::Tag(&local_2e0);
      AixLog::operator<<((ostream *)&local_2e0,(Tag *)pFVar16);
      local_358 = std::chrono::_V2::system_clock::now();
      local_360 = &PTR__Timestamp_001d8f28;
      local_350 = 0;
      AixLog::operator<<((ostream *)&local_360,(Timestamp *)pFVar16);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_310,"optimize_func",&local_36a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                 ,&local_369);
      pFVar16 = (Function *)local_310;
      AixLog::Function::Function((Function *)local_2b0,(string *)local_310,&local_330,0x1b2);
      AixLog::operator<<((ostream *)local_2b0,pFVar16);
      poVar6 = std::operator<<((ostream *)&std::clog,"variable ");
      (*(code *)**(undefined8 **)(p_Var11 + 1))(p_Var11 + 1,poVar6);
      poVar6 = std::operator<<(poVar6," color: ");
      pFVar16 = (Function *)(ulong)*(uint *)&p_Var11[1]._M_left;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(uint *)&p_Var11[1]._M_left);
      std::endl<char,std::char_traits<char>>(poVar6);
      AixLog::Function::~Function((Function *)local_2b0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)local_310);
      AixLog::Tag::~Tag(&local_2e0);
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      peVar14 = ((conflict_map.
                  super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->color_map).
                super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    }
    var.super_Displayable._vptr_Displayable =
         (_func_int **)((ulong)var.super_Displayable._vptr_Displayable._1_7_ << 8);
    AixLog::operator<<((ostream *)&var,(Severity *)pFVar16);
    AixLog::Tag::Tag(&local_2e0);
    AixLog::operator<<((ostream *)&local_2e0,(Tag *)pFVar16);
    local_358 = std::chrono::_V2::system_clock::now();
    local_360 = &PTR__Timestamp_001d8f28;
    local_350 = 0;
    AixLog::operator<<((ostream *)&local_360,(Timestamp *)pFVar16);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_310,"optimize_func",&local_36a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
               ,&local_369);
    pFVar16 = (Function *)local_310;
    AixLog::Function::Function((Function *)local_2b0,(string *)pFVar16,&local_330,0x1b5);
    AixLog::operator<<((ostream *)local_2b0,pFVar16);
    poVar6 = std::operator<<((ostream *)&std::clog,"****************************************");
    std::endl<char,std::char_traits<char>>(poVar6);
    AixLog::Function::~Function((Function *)local_2b0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)local_310);
    AixLog::Tag::~Tag(&local_2e0);
    livevar_analyse::Livevar_Analyse::~Livevar_Analyse(&lva);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&conflict_map.
                super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&map.
                super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&cross_blk_vars._M_t);
  }
  return;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func) {
    if (func.type->is_extern) {
      return;
    }
    LOG(TRACE) << "Running graph coloring for" << func.name << std::endl;
    std::set<mir::inst::VarId> cross_blk_vars;
    auto map = std::make_shared<Color_Map>(std::map<mir::inst::VarId, color>());
    func_color_map.insert({funcId, map});
    func_conflict_map[funcId] = std::make_shared<Conflict_Map>(
        Conflict_Map(func_color_map[funcId], func, color_num));
    auto conflict_map = func_conflict_map[funcId];
    func_unused_colors.insert({funcId, conflict_map->unused_colors});
    livevar_analyse::Livevar_Analyse lva(func, true);
    lva.build();
    for (auto iter = lva.livevars.begin(); iter != lva.livevars.end(); ++iter) {
      init_cross_blk_vars(iter->second, cross_blk_vars);
    }
    LOG(TRACE) << " Conflict map :" << std::endl;

    if (enable) {
      for (auto iter = func.basic_blks.begin(); iter != func.basic_blks.end();
           ++iter) {
        init_conflict_map(lva.livevars[iter->first], conflict_map,
                          cross_blk_vars);
      }
      conflict_map->init_edge_vars();
      for (auto& pair : conflict_map->dynamic_Map) {
        LOG(TRACE) << pair.first << " conflicts with : ";
        for (auto var : pair.second) {
          LOG(TRACE) << var << ", ";
        }
        LOG(TRACE) << std::endl;
      }
      while (!conflict_map->dynamic_Map.empty()) {
        conflict_map->remove_edge_less_colors();
        conflict_map->remove_edge_larger_colors();
      }
      conflict_map->rebuild();
    }

    for (auto& var : cross_blk_vars) {
      if (!conflict_map->color_map->count(var)) {
        conflict_map->color_map->insert(std::make_pair(var, -1));
      }
    }
    LOG(TRACE) << func.name << " coloring result : " << std::endl;
    LOG(TRACE) << "unused colors : ";
    for (auto c : *conflict_map->unused_colors) {
      LOG(TRACE) << c << " ";
    }
    LOG(TRACE) << std::endl;
    for (auto iter = conflict_map->color_map->begin();
         iter != conflict_map->color_map->end(); iter++) {
      LOG(TRACE) << "variable " << iter->first << " color: " << iter->second
                 << std::endl;
    }
    LOG(TRACE) << "****************************************" << std::endl;
  }